

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

int32_t __thiscall icu_63::NFRule::indexOfAnyRulePrefix(NFRule *this)

{
  int32_t iVar1;
  int local_18;
  int32_t pos;
  int i;
  int result;
  NFRule *this_local;
  
  pos = -1;
  local_18 = 0;
  while (*(long *)(RULE_PREFIXES + (long)local_18 * 8) != 0) {
    iVar1 = UnicodeString::indexOf
                      (&this->fRuleText,**(char16_t **)(RULE_PREFIXES + (long)local_18 * 8));
    if ((iVar1 != -1) && ((pos == -1 || (iVar1 < pos)))) {
      pos = iVar1;
    }
    local_18 = local_18 + 1;
  }
  return pos;
}

Assistant:

int32_t
NFRule::indexOfAnyRulePrefix() const
{
    int result = -1;
    for (int i = 0; RULE_PREFIXES[i]; i++) {
        int32_t pos = fRuleText.indexOf(*RULE_PREFIXES[i]);
        if (pos != -1 && (result == -1 || pos < result)) {
            result = pos;
        }
    }
    return result;
}